

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  CodedInputStream coded_input;
  CodedInputStream local_68;
  
  local_68.buffer_ = (uint8_t *)0x0;
  local_68.buffer_end_ = (uint8_t *)0x0;
  local_68._24_6_ = 0;
  local_68.overflow_bytes_._2_2_ = 0;
  local_68.last_tag_ = 0;
  local_68.legitimate_message_end_ = false;
  local_68.aliasing_enabled_ = false;
  local_68.current_limit_ = 0x7fffffff;
  local_68.buffer_size_after_limit_ = 0;
  local_68.total_bytes_limit_ = 0x7fffffff;
  local_68.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_68.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_68.extension_pool_ = (DescriptorPool *)0x0;
  local_68.extension_factory_ = (MessageFactory *)0x0;
  local_68.input_ = input;
  io::CodedInputStream::Refresh(&local_68);
  bVar1 = ParseFromCodedStream(this,&local_68);
  bVar1 = (bool)(bVar1 & local_68.legitimate_message_end_);
  io::CodedInputStream::~CodedInputStream(&local_68);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}